

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O1

t_float fielddesc_getfloat(_fielddesc *f,t_template *template,t_word *wp,int loud)

{
  t_float tVar1;
  
  if (f->fd_type != '\x01') {
    if (loud != 0) {
      pd_error((void *)0x0,"symbolic data field used as number");
    }
    return 0.0;
  }
  if (f->fd_var != '\0') {
    tVar1 = template_getfloat(template,(f->fd_un).fd_symbol,wp,loud);
    return tVar1;
  }
  return (f->fd_un).fd_float;
}

Assistant:

static t_float fielddesc_getfloat(t_fielddesc *f, t_template *template,
    t_word *wp, int loud)
{
    if (f->fd_type == A_FLOAT)
    {
        if (f->fd_var)
            return (template_getfloat(template, f->fd_un.fd_varsym, wp, loud));
        else return (f->fd_un.fd_float);
    }
    else
    {
        if (loud)
            pd_error(0, "symbolic data field used as number");
        return (0);
    }
}